

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flute.c
# Opt level: O0

int wirelength(Tree t)

{
  int iVar1;
  Branch *pBVar2;
  int local_30;
  int local_28;
  int local_24;
  int l;
  int j;
  int i;
  Tree t_local;
  
  pBVar2 = t.branch;
  local_24 = 0;
  for (l = 0; j = t.deg, l < j * 2 + -2; l = l + 1) {
    iVar1 = pBVar2[l].n;
    if (pBVar2[iVar1].x < pBVar2[l].x) {
      local_28 = pBVar2[l].x - pBVar2[iVar1].x;
    }
    else {
      local_28 = pBVar2[iVar1].x - pBVar2[l].x;
    }
    if (pBVar2[iVar1].y < pBVar2[l].y) {
      local_30 = pBVar2[l].y - pBVar2[iVar1].y;
    }
    else {
      local_30 = pBVar2[iVar1].y - pBVar2[l].y;
    }
    local_24 = local_28 + local_30 + local_24;
  }
  return local_24;
}

Assistant:

DTYPE wirelength(Tree t)
{
    int i, j;
    DTYPE l=0;

    for (i=0; i<2*t.deg-2; i++) {
        j = t.branch[i].n;
        l += ADIFF(t.branch[i].x, t.branch[j].x)
            + ADIFF(t.branch[i].y, t.branch[j].y);
    }

    return l;
}